

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

ssize_t __thiscall
capnp::anon_unknown_0::BrokenRequest::send
          (BrokenRequest *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ArrayDisposer *pAVar1;
  Refcounted *refcounted;
  undefined4 in_register_00000034;
  Exception *other;
  _func_int **local_198;
  char *local_190;
  Exception local_188;
  
  other = (Exception *)(CONCAT44(in_register_00000034,__fd) + 8);
  kj::Exception::Exception(&local_188,other);
  kj::heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>((kj *)&local_198,&local_188);
  pAVar1 = (ArrayDisposer *)operator_new(0x170);
  *(undefined4 *)&pAVar1[2]._vptr_ArrayDisposer = 0;
  pAVar1->_vptr_ArrayDisposer = (_func_int **)&PTR_addRef_00641fa8;
  pAVar1[1]._vptr_ArrayDisposer = (_func_int **)&DAT_00641fe0;
  kj::Exception::Exception((Exception *)(pAVar1 + 3),other);
  *(int *)&pAVar1[2]._vptr_ArrayDisposer = *(int *)&pAVar1[2]._vptr_ArrayDisposer + 1;
  (this->super_RequestHook)._vptr_RequestHook = local_198;
  (this->exception).ownFile.content.ptr = local_190;
  (this->exception).ownFile.content.size_ = (size_t)(pAVar1 + 1);
  (this->exception).ownFile.content.disposer = pAVar1;
  (this->exception).file = (char *)0x0;
  (this->exception).line = 0;
  (this->exception).type = FAILED;
  (this->exception).description.content.ptr = (char *)0x0;
  kj::Exception::~Exception(&local_188);
  return (ssize_t)this;
}

Assistant:

RemotePromise<AnyPointer> send() override {
    return RemotePromise<AnyPointer>(kj::cp(exception),
        AnyPointer::Pipeline(kj::refcounted<BrokenPipeline>(exception)));
  }